

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset.c
# Opt level: O1

void * memset(void *__s,int __c,size_t __n)

{
  size_t sVar1;
  uchar *p;
  
  if (__n != 0) {
    sVar1 = 0;
    do {
      *(char *)((long)__s + sVar1) = (char)__c;
      sVar1 = sVar1 + 1;
    } while (__n != sVar1);
  }
  return __s;
}

Assistant:

void * memset( void * s, int c, size_t n )
{
    unsigned char * p = ( unsigned char * ) s;

    while ( n-- )
    {
        *p++ = ( unsigned char ) c;
    }

    return s;
}